

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O1

Roaring64Map * __thiscall
doublechecked::Roaring64Map::operator^
          (Roaring64Map *__return_storage_ptr__,Roaring64Map *this,Roaring64Map *o)

{
  bool bVar1;
  Roaring64Map *r;
  Roaring64Map inplace;
  Roaring64Map RStack_88;
  
  roaring::Roaring64Map::operator^(&RStack_88.plain,&this->plain,&o->plain);
  Roaring64Map(__return_storage_ptr__,&RStack_88.plain);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&RStack_88);
  Roaring64Map(&RStack_88,this);
  r = operator^=(&RStack_88,o);
  bVar1 = operator==(__return_storage_ptr__,r);
  _assert_true((ulong)bVar1,"ans == (inplace ^= o)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64map_checked.hh"
               ,0x1ea);
  ~Roaring64Map(&RStack_88);
  return __return_storage_ptr__;
}

Assistant:

Roaring64Map operator^(const Roaring64Map &o) const {
        Roaring64Map ans(plain ^ o.plain);

        Roaring64Map inplace(*this);
        assert_true(ans ==
                    (inplace ^= o));  // validate against in-place version

        return ans;
    }